

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::Disconnect(Session *this)

{
  long lVar1;
  size_type sVar2;
  Sock *pSVar3;
  bool bVar4;
  Level in_ESI;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl != (Sock *)0x0) {
    sVar2 = (this->m_session_id)._M_string_length;
    bVar4 = ::LogAcceptCategory(TOR,in_ESI);
    if (sVar2 == 0) {
      if (bVar4) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file_00._M_len = 0x57;
        logging_function_00._M_str = "Disconnect";
        logging_function_00._M_len = 10;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x1e5,I2P,Info,
                   (ConstevalFormatString<0U>)0xc8ee1e);
      }
    }
    else if (bVar4) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "Disconnect";
      logging_function._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x1e7,I2P,Info,(ConstevalFormatString<1U>)0xc8ee41,
                 &this->m_session_id);
    }
    pSVar3 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>.
             _M_t.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (Sock *)0x0;
    if (pSVar3 != (Sock *)0x0) {
      (*pSVar3->_vptr_Sock[1])();
    }
  }
  (this->m_session_id)._M_string_length = 0;
  *(this->m_session_id)._M_dataplus._M_p = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::Disconnect()
{
    if (m_control_sock) {
        if (m_session_id.empty()) {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying incomplete SAM session\n");
        } else {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying SAM session %s\n", m_session_id);
        }
        m_control_sock.reset();
    }
    m_session_id.clear();
}